

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *psVar4;
  ostream *poVar5;
  long in_RSI;
  long in_RDI;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  undefined8 in_stack_fffffffffffffe18;
  Code _colourCode;
  Colour *in_stack_fffffffffffffe20;
  Colour *this_00;
  allocator local_101;
  string local_100 [38];
  Colour local_da;
  allocator local_d9;
  string local_d8 [38];
  Colour local_b2;
  allocator local_b1;
  string local_b0 [38];
  Colour local_8a;
  allocator local_89;
  string local_88 [35];
  Colour local_65 [20];
  allocator local_51;
  string local_50 [39];
  Colour local_29;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  sVar2 = Counts::total((Counts *)(in_RSI + 0x18));
  if (sVar2 == 0) {
    poVar5 = *(ostream **)(in_RDI + 0x18);
    this_00 = &local_da;
    Colour::Colour(this_00,(Code)((ulong)poVar5 >> 0x20));
    poVar5 = Catch::operator<<(poVar5,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,0x4f,'=',&local_101);
    std::operator<<(poVar5,local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    Colour::~Colour((Colour *)0x1ed75c);
  }
  else {
    sVar2 = *(size_t *)(local_10 + 0x20);
    sVar3 = Counts::total((Counts *)(local_10 + 0x18));
    local_18 = makeRatio(sVar2,sVar3);
    sVar2 = *(size_t *)(local_10 + 0x28);
    sVar3 = Counts::total((Counts *)(local_10 + 0x18));
    local_20 = makeRatio(sVar2,sVar3);
    sVar2 = *(size_t *)(local_10 + 0x18);
    sVar3 = Counts::total((Counts *)(local_10 + 0x18));
    local_28 = makeRatio(sVar2,sVar3);
    while (local_18 + local_20 + local_28 < 0x4f) {
      psVar4 = findMax(&local_18,&local_20,&local_28);
      *psVar4 = *psVar4 + 1;
    }
    while (_colourCode = (Code)((ulong)in_stack_fffffffffffffe18 >> 0x20),
          0x4f < local_18 + local_20 + local_28) {
      psVar4 = findMax(&local_18,&local_20,&local_28);
      *psVar4 = *psVar4 - 1;
    }
    poVar5 = *(ostream **)(in_RDI + 0x18);
    Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
    poVar5 = Catch::operator<<(poVar5,&local_29);
    sVar2 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,sVar2,'=',&local_51);
    std::operator<<(poVar5,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    Colour::~Colour((Colour *)0x1ed30b);
    poVar5 = *(ostream **)(in_RDI + 0x18);
    Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
    poVar5 = Catch::operator<<(poVar5,local_65);
    sVar2 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,sVar2,'=',&local_89);
    std::operator<<(poVar5,local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    Colour::~Colour((Colour *)0x1ed3d1);
    bVar1 = Counts::allPassed((Counts *)(local_10 + 0x18));
    if (bVar1) {
      poVar5 = *(ostream **)(in_RDI + 0x18);
      Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
      poVar5 = Catch::operator<<(poVar5,&local_8a);
      sVar2 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,sVar2,'=',&local_b1);
      std::operator<<(poVar5,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      Colour::~Colour((Colour *)0x1ed49f);
    }
    else {
      poVar5 = *(ostream **)(in_RDI + 0x18);
      Colour::Colour(in_stack_fffffffffffffe20,_colourCode);
      poVar5 = Catch::operator<<(poVar5,&local_b2);
      sVar2 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,sVar2,'=',&local_d9);
      std::operator<<(poVar5,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      Colour::~Colour((Colour *)0x1ed65a);
    }
  }
  std::operator<<(*(ostream **)(in_RDI + 0x18),"\n");
  return;
}

Assistant:

void printTotalsDivider( Totals const& totals ) {
            if( totals.testCases.total() > 0 ) {
                std::size_t failedRatio = makeRatio( totals.testCases.failed, totals.testCases.total() );
                std::size_t failedButOkRatio = makeRatio( totals.testCases.failedButOk, totals.testCases.total() );
                std::size_t passedRatio = makeRatio( totals.testCases.passed, totals.testCases.total() );
                while( failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH-1 )
                    findMax( failedRatio, failedButOkRatio, passedRatio )++;
                while( failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH-1 )
                    findMax( failedRatio, failedButOkRatio, passedRatio )--;

                stream << Colour( Colour::Error ) << std::string( failedRatio, '=' );
                stream << Colour( Colour::ResultExpectedFailure ) << std::string( failedButOkRatio, '=' );
                if( totals.testCases.allPassed() )
                    stream << Colour( Colour::ResultSuccess ) << std::string( passedRatio, '=' );
                else
                    stream << Colour( Colour::Success ) << std::string( passedRatio, '=' );
            }
            else {
                stream << Colour( Colour::Warning ) << std::string( CATCH_CONFIG_CONSOLE_WIDTH-1, '=' );
            }
            stream << "\n";
        }